

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O2

void adapt::cuf::detail::WriteUnsignedInt<double>(ostringstream *str,double *arg,char mod)

{
  int iVar1;
  undefined8 *puVar2;
  undefined7 in_register_00000011;
  
  iVar1 = (int)CONCAT71(in_register_00000011,mod);
  switch(iVar1) {
  case 0x67:
    Write_impl<unsigned_char,_double,_true>::f((ostream *)str,arg);
    return;
  case 0x68:
    Write_impl<unsigned_short,_double,_true>::f((ostream *)str,arg);
    return;
  case 0x69:
  case 0x6a:
  case 0x6b:
    goto switchD_0010912b_caseD_69;
  case 0x6c:
switchD_0010912b_caseD_6c:
    Write_impl<unsigned_long,_double,_true>::f((ostream *)str,arg);
    return;
  case 0x6d:
    Write_impl<unsigned_long_long,_double,_true>::f((ostream *)str,arg);
    return;
  default:
    if (iVar1 == 0) {
      std::ostream::_M_insert<unsigned_long>((ulong)str);
      return;
    }
    if (iVar1 == 0x3f) {
      WriteAnyUnsignedInt_impl<double,_true,_false,_false>::f((ostream *)str,*arg);
      return;
    }
    if (iVar1 == 0x7a) goto switchD_0010912b_caseD_6c;
switchD_0010912b_caseD_69:
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = std::__cxx11::string::pop_back;
    __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
  }
}

Assistant:

void WriteUnsignedInt(std::ostringstream& str, const Value& arg, char mod)
{
	switch (mod)
	{
	case 'z': Write<std::size_t>(str, arg); break;
	case 'm': Write<unsigned long long>(str, arg); break;
	case 'l': Write<unsigned long>(str, arg); break;
	case 0: Write<unsigned int>(str, arg); break;
	case 'h': Write<unsigned short>(str, arg); break;
	case 'g': Write<unsigned char>(str, arg); break;
	case '?': WriteAnyUnsignedInt(str, arg); break;
	default: throw std::exception(); break;
	}
}